

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O2

ImportStatus try_path(string *dir,string *rel,string *content,string *found_here,string *err_msg)

{
  int *piVar1;
  ImportStatus IVar2;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  string abs_path;
  ifstream f;
  int aiStack_208 [50];
  undefined8 auStack_140 [36];
  
  abs_path._M_dataplus._M_p = (pointer)&abs_path.field_2;
  abs_path._M_string_length = 0;
  abs_path.field_2._M_local_buf[0] = '\0';
  if (rel->_M_string_length != 0) {
    if (*(rel->_M_dataplus)._M_p == '/') {
      std::__cxx11::string::_M_assign((string *)&abs_path);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,dir,rel
                    );
      std::__cxx11::string::operator=((string *)&abs_path,(string *)&f);
      std::__cxx11::string::~string((string *)&f);
    }
    if (abs_path._M_dataplus._M_p[abs_path._M_string_length - 1] != '/') {
      std::ifstream::ifstream(&f);
      std::ifstream::open((char *)&f,(_Ios_Openmode)abs_path._M_dataplus._M_p);
      if (*(int *)((long)aiStack_208 + *(long *)(_f + -0x18)) == 0) {
        __first._8_8_ = 0xffffffffffffffff;
        __first._M_sbuf = *(streambuf_type **)((long)auStack_140 + *(long *)(_f + -0x18));
        std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                  ((string *)content,__first,
                   (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40)
                  );
        if (*(int *)((long)aiStack_208 + *(long *)(_f + -0x18)) == 0) {
          IVar2 = IMPORT_STATUS_OK;
          std::__cxx11::string::_M_assign((string *)found_here);
        }
        else {
          piVar1 = __errno_location();
          strerror(*piVar1);
          std::__cxx11::string::assign((char *)err_msg);
          IVar2 = IMPORT_STATUS_IO_ERROR;
        }
      }
      else {
        IVar2 = IMPORT_STATUS_FILE_NOT_FOUND;
      }
      std::ifstream::~ifstream(&f);
      goto LAB_0015cd5c;
    }
  }
  std::__cxx11::string::assign((char *)err_msg);
  IVar2 = IMPORT_STATUS_IO_ERROR;
LAB_0015cd5c:
  std::__cxx11::string::~string((string *)&abs_path);
  return IVar2;
}

Assistant:

static enum ImportStatus try_path(const std::string &dir, const std::string &rel,
                                  std::string &content, std::string &found_here,
                                  std::string &err_msg)
{
    std::string abs_path;
    if (rel.length() == 0) {
        err_msg = "the empty string is not a valid filename";
        return IMPORT_STATUS_IO_ERROR;
    }
    // It is possible that rel is actually absolute.
    if (rel[0] == '/') {
        abs_path = rel;
    } else {
        abs_path = dir + rel;
    }

    if (abs_path[abs_path.length() - 1] == '/') {
        err_msg = "attempted to import a directory";
        return IMPORT_STATUS_IO_ERROR;
    }

    std::ifstream f;
    f.open(abs_path.c_str());
    if (!f.good())
        return IMPORT_STATUS_FILE_NOT_FOUND;
    try {
        content.assign(std::istreambuf_iterator<char>(f), std::istreambuf_iterator<char>());
    } catch (const std::ios_base::failure &io_err) {
        err_msg = io_err.what();
        return IMPORT_STATUS_IO_ERROR;
    }
    if (!f.good()) {
        err_msg = strerror(errno);
        return IMPORT_STATUS_IO_ERROR;
    }

    found_here = abs_path;

    return IMPORT_STATUS_OK;
}